

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reader.c
# Opt level: O2

void rdr_freedat(dat_t *dat)

{
  uint32_t i;
  ulong uVar1;
  
  for (uVar1 = 0; uVar1 < dat->nseq; uVar1 = uVar1 + 1) {
    rdr_freeseq(dat->seq[uVar1]);
  }
  free(dat->seq);
  free(dat);
  return;
}

Assistant:

void rdr_freedat(dat_t *dat) {
	for (uint32_t i = 0; i < dat->nseq; i++)
		rdr_freeseq(dat->seq[i]);
	free(dat->seq);
	free(dat);
}